

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type * __thiscall
QList<QSocks5RevivedDatagram>::takeFirst(QList<QSocks5RevivedDatagram> *this)

{
  QArrayDataPointer<QSocks5RevivedDatagram> *in_RSI;
  QSocks5RevivedDatagram *in_RDI;
  value_type *v;
  QSocks5RevivedDatagram *in_stack_ffffffffffffffc8;
  
  memset(in_RDI,0xaa,0x28);
  first((QList<QSocks5RevivedDatagram> *)in_RDI);
  QSocks5RevivedDatagram::QSocks5RevivedDatagram(in_RDI,in_stack_ffffffffffffffc8);
  QArrayDataPointer<QSocks5RevivedDatagram>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::eraseFirst
            ((QGenericArrayOps<QSocks5RevivedDatagram> *)in_RDI);
  return in_RDI;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }